

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsp_helper.c
# Opt level: O0

uint16_t mipsdsp_sat16_sub(int16_t a,int16_t b,CPUMIPSState_conflict5 *env)

{
  undefined2 local_1a;
  int16_t temp;
  CPUMIPSState_conflict5 *env_local;
  int16_t b_local;
  int16_t a_local;
  
  local_1a = a - b;
  if (((int)(short)((a ^ b) & (a ^ local_1a)) & 0x8000U) != 0) {
    if (a < 0) {
      local_1a = 0x8000;
    }
    else {
      local_1a = 0x7fff;
    }
    set_DSPControl_overflow_flag(1,0x14,env);
  }
  return local_1a;
}

Assistant:

static inline uint16_t mipsdsp_sat16_sub(int16_t a, int16_t b,
                                         CPUMIPSState *env)
{
    int16_t  temp;

    temp = a - b;
    if (MIPSDSP_OVERFLOW_SUB(a, b, temp, 0x8000)) {
        if (a >= 0) {
            temp = 0x7FFF;
        } else {
            temp = 0x8000;
        }
        set_DSPControl_overflow_flag(1, 20, env);
    }

    return temp;
}